

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLockLock::UpdateState(ChLinkLockLock *this)

{
  ChQuaternion<double> *q;
  ChVectorN<double,_7> *__dest;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ChMarker *pCVar61;
  ChBodyFrame *pCVar62;
  ChBodyFrame *pCVar63;
  ChMarker *pCVar64;
  ChFrameMoving<double> *this_00;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined4 uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar73;
  uint uVar74;
  double *pdVar75;
  ulong uVar76;
  long lVar77;
  char *__function;
  Index outer;
  Index outer_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  double dVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  double dVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  double dVar225;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  ChVector<double> Qcx;
  ChQuaternion<double> Qcr;
  ChStarMatrix44<double> stempDC;
  ChStarMatrix44<double> stempQ2;
  DstEvaluatorType dstEvaluator_1;
  ChStarMatrix33<double> mtemp1;
  ChMatrix33<double> CqxT;
  ChStarMatrix33<double> tmpStar;
  ChMatrix33<double> mtemp3;
  ChGlMatrix34<double> body2Gl;
  ChGlMatrix34<double> body1Gl;
  ChStarMatrix33<double> Q2star;
  ChStarMatrix33<double> P1star;
  ChMatrix33<double> m2_Rel_A_dtdt;
  ChMatrix33<double> m2_Rel_A_dt;
  undefined1 local_6a0 [16];
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  ChQuaternion<double> *local_670;
  ChQuaternion<double> *local_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  ChQuaternion<double> *local_648;
  undefined1 local_640 [16];
  SrcEvaluatorType *pSStack_630;
  double dStack_628;
  ChMatrix33<double> *local_620;
  DstXprType *local_618;
  double local_610;
  Matrix<double,_3,_3,_1,_3,_3> *local_608;
  Matrix<double,_3,_3,_1,_3,_3> *local_600;
  Matrix<double,_3,_4,_1,_3,_4> *local_5f8;
  DstXprType *local_5f0;
  undefined8 local_5e8;
  Matrix<double,_3,_4,_1,_3,_4> *local_5e0;
  undefined8 local_5d8;
  ChMatrix33<double> *local_5d0;
  DstXprType *local_5c8;
  undefined1 local_5c0 [24];
  double local_5a8;
  ChMatrix33<double> *local_5a0;
  DstXprType *local_598;
  undefined8 local_590;
  Matrix<double,_3,_3,_1,_3,_3> *local_588;
  Matrix<double,_3,_3,_1,_3,_3> *local_580;
  Matrix<double,_3,_4,_1,_3,_4> *local_578;
  DstXprType *local_570;
  undefined8 local_568;
  Matrix<double,_3,_4,_1,_3,_4> *local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined1 local_540 [12];
  uint uStack_534;
  undefined8 uStack_530;
  double dStack_528;
  ChMatrix33<double> *local_520;
  DstXprType *local_518;
  undefined8 local_510;
  undefined8 uStack_508;
  Matrix<double,_3,_3,_1,_3,_3> *local_500;
  Matrix<double,_3,_4,_1,_3,_4> *local_4f8;
  DstXprType *local_4f0;
  double local_4e8;
  Matrix<double,_3,_4,_1,_3,_4> *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  DstXprType *local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  ChQuaternion<double> *local_4a8;
  ChQuaternion<double> local_4a0;
  SrcEvaluatorType local_480;
  double adStack_3c0 [2];
  DstXprType local_3b0;
  DstXprType local_368;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_320;
  DstXprType local_300;
  Matrix<double,_3,_4,_1,_3,_4> local_260;
  Matrix<double,_3,_4,_1,_3,_4> local_200;
  Matrix<double,_3,_3,_1,_3,_3> local_198;
  DstXprType local_150;
  ChMatrix33<double> local_108;
  ChMatrix33<double> local_c0 [2];
  
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar106._0_8_ =
       -local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3];
  auVar106._8_8_ = 0x8000000000000000;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar106);
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar81 = vunpcklpd_avx(auVar81,auVar78);
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar81._0_8_;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar81._8_8_;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar79._0_8_ =
       -local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3];
  auVar79._8_8_ = 0x8000000000000000;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar79);
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar81 = vunpcklpd_avx(auVar82,auVar80);
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar81._0_8_;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar81._8_8_;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  pCVar62 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[7] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [1] + local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[1];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[7] =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [7] + local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[7];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[9] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[9] =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [9] + local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[9];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [2] + local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[2];
  auVar166._0_8_ =
       -local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[7];
  auVar166._8_8_ = 0x8000000000000000;
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] =
       (double)vmovlpd_avx(auVar166);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3] =
       -local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[9];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[4] =
       -local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[9];
  auVar146._0_8_ =
       -local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[2];
  auVar146._8_8_ = 0x8000000000000000;
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar146);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[8] =
       (double)vmovlpd_avx(auVar146);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[10]
       = (double)vmovlpd_avx(auVar166);
  pCVar62 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[7] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] =
       local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [1] + local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[1];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[7] =
       local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [7] + local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[7];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[9] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[9] =
       local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [9] + local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[9];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] =
       local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [2] + local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data
             .array[2];
  auVar167._0_8_ =
       -local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[7];
  auVar167._8_8_ = 0x8000000000000000;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] =
       (double)vmovlpd_avx(auVar167);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3] =
       -local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[9];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[4] =
       -local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[9];
  auVar147._0_8_ =
       -local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
        array[2];
  auVar147._8_8_ = 0x8000000000000000;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar147);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[8] =
       (double)vmovlpd_avx(auVar147);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[10]
       = (double)vmovlpd_avx(auVar167);
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data[2];
  dVar1 = (this->deltaC).pos.m_data[2];
  dVar2 = (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data[1];
  dVar3 = (this->deltaC).pos.m_data[1];
  (this->relC).pos.m_data[0] =
       (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data[0] -
       (this->deltaC).pos.m_data[0];
  (this->relC).pos.m_data[1] = dVar2 - dVar3;
  (this->relC).pos.m_data[2] = dVar165 - dVar1;
  q = &(this->deltaC).rot;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[6] =
       local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [1];
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0xb]
       = local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[1];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[6] =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
       [1];
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0xb]
       = local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[1];
  Qconjugate(q);
  local_670 = &(this->super_ChLinkLock).super_ChLinkMarkers.relM.rot;
  Qcross((ChQuaternion<double> *)&local_300,local_670);
  if (&local_480 != (SrcEvaluatorType *)&(this->relC).rot) {
    (this->relC).rot.m_data[0] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC).rot.m_data[1] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC).rot.m_data[2] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC).rot.m_data[3] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data[2];
  dVar1 = (this->deltaC_dt).pos.m_data[2];
  dVar2 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data[1];
  dVar3 = (this->deltaC_dt).pos.m_data[1];
  (this->relC_dt).pos.m_data[0] =
       (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data[0] -
       (this->deltaC_dt).pos.m_data[0];
  (this->relC_dt).pos.m_data[1] = dVar2 - dVar3;
  (this->relC_dt).pos.m_data[2] = dVar165 - dVar1;
  local_668 = &(this->deltaC_dt).rot;
  Qconjugate(local_668);
  Qcross((ChQuaternion<double> *)local_640,local_670);
  Qconjugate(q);
  local_648 = &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.rot;
  Qcross((ChQuaternion<double> *)local_5c0,local_648);
  Qadd((ChQuaternion<double> *)&local_300,(ChQuaternion<double> *)local_540);
  if (&local_480 != (SrcEvaluatorType *)&(this->relC_dt).rot) {
    (this->relC_dt).rot.m_data[0] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC_dt).rot.m_data[1] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC_dt).rot.m_data[2] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC_dt).rot.m_data[3] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data[2];
  dVar1 = (this->deltaC_dtdt).pos.m_data[2];
  dVar2 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data[1];
  dVar3 = (this->deltaC_dtdt).pos.m_data[1];
  (this->relC_dtdt).pos.m_data[0] =
       (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data[0] -
       (this->deltaC_dtdt).pos.m_data[0];
  (this->relC_dtdt).pos.m_data[1] = dVar2 - dVar3;
  (this->relC_dtdt).pos.m_data[2] = dVar165 - dVar1;
  local_4a8 = &(this->deltaC_dtdt).rot;
  Qconjugate(local_4a8);
  Qcross((ChQuaternion<double> *)local_540,local_670);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_c0,
         &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.rot);
  Qadd((ChQuaternion<double> *)local_640,(ChQuaternion<double> *)local_5c0);
  Qconjugate(local_668);
  Qcross((ChQuaternion<double> *)(&local_3b0 + 1),local_648);
  Qscale((ChQuaternion<double> *)&local_108,(ChQuaternion<double> *)&local_3b0,2.0);
  Qadd((ChQuaternion<double> *)&local_300,(ChQuaternion<double> *)&local_108);
  if (&local_480 != (SrcEvaluatorType *)&(this->relC_dtdt).rot) {
    (this->relC_dtdt).rot.m_data[0] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC_dtdt).rot.m_data[1] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC_dtdt).rot.m_data[2] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC_dtdt).rot.m_data[3] =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             local_c0);
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             &local_108);
  pCVar62 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  pCVar63 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       *(double *)
        ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar168._8_8_ = 0;
  auVar168._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       *(double *)
        ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar199._8_8_ = 0;
  auVar199._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  dVar1 = *(double *)
           ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar165 * dVar1;
  auVar81 = vfmadd231sd_fma(auVar83,auVar187,auVar199);
  auVar81 = vfmadd231sd_fma(auVar81,auVar148,auVar168);
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       *(double *)
        ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  dVar2 = *(double *)
           ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       (pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       *(double *)
        ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar2 * dVar165;
  auVar82 = vfmadd231sd_fma(auVar107,auVar221,auVar199);
  auVar82 = vfmadd231sd_fma(auVar82,auVar219,auVar168);
  auVar223._8_8_ = 0;
  auVar223._0_8_ =
       *(double *)
        ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  dVar3 = *(double *)
           ((long)&(pCVar63->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar3 * dVar165;
  auVar106 = vfmadd231sd_fma(auVar127,auVar222,auVar199);
  auVar106 = vfmadd231sd_fma(auVar106,auVar223,auVar168);
  dVar126 = auVar106._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       dVar126 * local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar106 = vfmadd231sd_fma(auVar169,auVar82,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar106 = vfmadd231sd_fma(auVar106,auVar81,auVar6);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  pCVar64 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = (pCVar64->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = (pCVar64->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  dVar165 = (pCVar64->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar226._8_8_ = 0;
  auVar226._0_8_ = dVar165;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar78 = vmulsd_avx512f(auVar226,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar78 = vfmadd231sd_avx512f(auVar78,auVar224,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar79 = vfmadd231sd_avx512f(auVar78,auVar200,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar78 = vmulsd_avx512f(auVar226,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar78 = vfmadd231sd_avx512f(auVar78,auVar224,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar80 = vfmadd231sd_avx512f(auVar78,auVar200,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar78 = vfmadd231sd_fma(auVar227,auVar224,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar78 = vfmadd231sd_fma(auVar78,auVar200,auVar14);
  dVar225 = auVar78._0_8_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar225 * dVar1;
  auVar78 = vfmadd231sd_avx512f(auVar201,auVar80,auVar187);
  auVar78 = vfmadd231sd_avx512f(auVar78,auVar79,auVar148);
  dVar165 = auVar78._0_8_ - (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar2 * dVar225;
  auVar78 = vfmadd231sd_avx512f(auVar188,auVar80,auVar221);
  auVar78 = vfmadd231sd_avx512f(auVar78,auVar79,auVar219);
  dVar1 = auVar78._0_8_ - (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar3 * dVar225;
  auVar78 = vfmadd231sd_avx512f(auVar202,auVar222,auVar80);
  auVar78 = vfmadd231sd_avx512f(auVar78,auVar223,auVar79);
  dVar2 = auVar78._0_8_ - (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar1;
  auVar215._8_8_ = 0;
  auVar215._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x28);
  auVar78 = vfmadd231sd_fma(auVar215,auVar189,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar165;
  auVar78 = vfmadd231sd_fma(auVar78,auVar149,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       dVar126 * local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar79 = vfmadd231sd_fma(auVar216,auVar82,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar79 = vfmadd231sd_fma(auVar79,auVar81,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar80 = vfmadd231sd_fma(auVar220,auVar189,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar80 = vfmadd231sd_fma(auVar80,auVar149,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       dVar126 * local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar82 = vfmadd231sd_fma(auVar128,auVar82,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar81 = vfmadd231sd_fma(auVar82,auVar81,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x18);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar1;
  auVar82 = vfmadd231sd_fma(auVar84,auVar190,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar165;
  auVar82 = vfmadd231sd_fma(auVar82,auVar150,auVar24);
  (this->super_ChLinkLock).Ct_temp.pos.m_data[0] =
       (auVar81._0_8_ + auVar82._0_8_) - (this->deltaC_dt).pos.m_data[0];
  (this->super_ChLinkLock).Ct_temp.pos.m_data[1] =
       (auVar80._0_8_ + auVar79._0_8_) - (this->deltaC_dt).pos.m_data[1];
  (this->super_ChLinkLock).Ct_temp.pos.m_data[2] =
       (auVar106._0_8_ + auVar78._0_8_) - (this->deltaC_dt).pos.m_data[2];
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)&local_300,&(this->super_ChLinkLock).super_ChLinkMarkers.q_AD);
  Qconjugate(local_668);
  Qcross((ChQuaternion<double> *)local_540,local_670);
  (this->super_ChLinkLock).Ct_temp.rot.m_data[0] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       + (double)local_640._0_8_;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[1] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       + (double)local_640._8_8_;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[2] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       + (double)pSStack_630;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[3] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       + dStack_628;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>
                ).super_ChFrame<double>.Amatrix;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_3b0;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_640;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)&local_480;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)local_540;
  local_640._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [3];
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_300);
  pCVar62 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar81 = vfmadd231sd_fma(auVar129,auVar85,auVar25);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar82 = vfmadd231sd_fma(auVar81,auVar151,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar81 = vfmadd231sd_fma(auVar170,auVar85,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar81 = vfmadd231sd_fma(auVar81,auVar151,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar106 = vfmadd231sd_fma(auVar108,auVar85,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar106 = vfmadd231sd_fma(auVar106,auVar151,auVar30);
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  auVar86._0_8_ = auVar106._0_8_ ^ 0x8000000000000000;
  auVar86._8_8_ = auVar106._8_8_ ^ 0x8000000000000000;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar86);
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)auVar81._0_8_;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)auVar106._0_8_;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  auVar81 = vunpcklpd_avx(auVar82,auVar81);
  local_660 = 0;
  uStack_65c = 0x80000000;
  uStack_658 = 0;
  uStack_654 = 0x80000000;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (double)(auVar81._0_8_ ^ 0x8000000000000000);
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (double)(auVar81._8_8_ ^ 0x8000000000000000);
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)auVar82._0_8_;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  pdVar75 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 2;
  lVar77 = 0x10;
  do {
    dVar165 = *(double *)((long)adStack_3c0 + lVar77 + 8);
    ((plain_array<double,_49,_1,_0> *)(pdVar75 + -2))->array[0] =
         *(double *)((long)adStack_3c0 + lVar77);
    pdVar75[-1] = dVar165;
    *pdVar75 = *(double *)
                ((long)local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array + lVar77);
    lVar77 = lVar77 + 0x18;
    pdVar75 = pdVar75 + 7;
  } while (lVar77 != 0x58);
  pdVar75 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 2;
  lVar77 = 0x10;
  do {
    dVar165 = *(double *)((long)adStack_3c0 + lVar77 + 8);
    ((plain_array<double,_49,_1,_0> *)(pdVar75 + -2))->array[0] =
         -*(double *)((long)adStack_3c0 + lVar77);
    pdVar75[-1] = -dVar165;
    auVar87._0_8_ =
         *(ulong *)((long)local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array + lVar77) ^ 0x8000000000000000;
    auVar87._8_8_ = 0x8000000000000000;
    dVar165 = (double)vmovlpd_avx(auVar87);
    *pdVar75 = dVar165;
    lVar77 = lVar77 + 0x18;
    pdVar75 = pdVar75 + 7;
  } while (lVar77 != 0x58);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_150;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       (double)&local_200;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_3b0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_4,_0,_3,_4> *)&local_480,
             (Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>
              *)&local_300,(assign_op<double,_double> *)local_640);
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[3] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[4] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[5] =
       (double)CONCAT44(local_480.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[6]._4_4_,
                        local_480.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[6]._0_4_);
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[6] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[10] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xb] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xc] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xd] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x11] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x12] =
       (double)CONCAT44(local_480.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5]._4_4_,
                        local_480.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5]._0_4_);
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x13] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x14] =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xb];
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_198;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_3b0;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_260;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_4,_0,_3,_4> *)&local_300,
             (Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>
              *)&local_480,(assign_op<double,_double> *)local_640);
  lVar77 = 6;
  pdVar75 = (double *)
            ((long)&local_480.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data + 0x10);
  do {
    dVar165 = *(double *)
               ((long)local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array + lVar77 * 8 + 0x18);
    auVar109._0_8_ =
         dVar165 * (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar109._8_8_ =
         dVar165 * *(double *)
                    ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data + 8);
    uVar4 = *(undefined8 *)
             ((long)local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array + lVar77 * 8 + 0x30);
    auVar65._8_8_ = uVar4;
    auVar65._0_8_ = uVar4;
    auVar81 = vfmadd132pd_avx512vl
                        (*(undefined1 (*) [16])
                          ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.
                                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data + 0x18),auVar109,auVar65);
    uVar4 = *(undefined8 *)
             ((long)(&local_3b0)[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array + lVar77 * 8);
    auVar66._8_8_ = uVar4;
    auVar66._0_8_ = uVar4;
    auVar81 = vfmadd231pd_avx512vl
                        (auVar81,*(undefined1 (*) [16])
                                  ((long)&(pCVar61->super_ChFrameMoving<double>).
                                          super_ChFrame<double>.Amatrix.
                                          super_Matrix<double,_3,_3,_1,_3,_3>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          .m_storage.m_data + 0x30),auVar66);
    *(undefined1 (*) [16])((plain_array<double,_16,_0,_64> *)(pdVar75 + -2))->array = auVar81;
    *pdVar75 = dVar165 * *(double *)
                          ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.
                                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data + 0x10) +
               *(double *)
                ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x28) *
               *(double *)
                ((long)local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array + lVar77 * 8 + 0x30) +
               *(double *)
                ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x40) *
               *(double *)
                ((long)(&local_3b0)[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array + lVar77 * 8);
    lVar77 = lVar77 + 1;
    pdVar75 = pdVar75 + 3;
  } while (lVar77 != 9);
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
       1.48219693752374e-323;
  auVar71._8_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
  ;
  auVar71._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
  ;
  auVar72._4_4_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       ._4_4_;
  auVar72._0_4_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       ._0_4_;
  auVar72._8_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
  ;
  lVar77 = 8;
  pdVar75 = local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array + 2;
  do {
    dVar165 = local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.
              m_data.array[lVar77 + 0xfffffffffffffff8];
    auVar217._0_8_ =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0] * dVar165;
    auVar217._8_8_ =
         local_480.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1] * dVar165;
    dVar1 = local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
            array[lVar77 + -4];
    auVar67._8_8_ = dVar1;
    auVar67._0_8_ = dVar1;
    auVar81 = vfmadd231pd_avx512vl(auVar217,auVar71,auVar67);
    dVar1 = local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
            array[lVar77];
    auVar68._8_8_ = dVar1;
    auVar68._0_8_ = dVar1;
    auVar81 = vfmadd231pd_avx512vl(auVar81,auVar72,auVar68);
    dVar1 = pdVar75[-1];
    ((plain_array<double,_16,_0,_64> *)(pdVar75 + -2))->array[0] =
         auVar81._0_8_ + ((plain_array<double,_16,_0,_64> *)(pdVar75 + -2))->array[0];
    pdVar75[-1] = auVar81._8_8_ + dVar1;
    *pdVar75 = local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[2] * dVar165 +
               local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[8] *
               local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.
               m_data.array[lVar77] +
               (double)CONCAT44(local_480.
                                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5]._4_4_,
                                local_480.
                                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5]._0_4_) *
               local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.
               m_data.array[lVar77 + -4] + *pdVar75;
    lVar77 = lVar77 + 1;
    pdVar75 = pdVar75 + 3;
  } while (lVar77 != 0xc);
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[3] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[4] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [3];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[5] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [6];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[6] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[10] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xb] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xc] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [7];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xd] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x11] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x12] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x13] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x14] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xb];
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       (double)&local_260;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       (double)&local_480;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
       (double)&local_260;
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross((ChQuaternion<double> *)&local_300,(ChQuaternion<double> *)local_540);
  auVar130._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1],0) ^ local_660;
  auVar130._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] >> 0x20) ^ uStack_65c;
  auVar130._8_4_ = uStack_658;
  auVar130._12_4_ = uStack_654;
  auVar171._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2],0) ^ local_660;
  auVar171._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar171._8_4_ = uStack_658;
  auVar171._12_4_ = uStack_654;
  auVar81 = vmovlhps_avx(auVar130,auVar171);
  local_640._8_8_ = auVar81._0_8_;
  pSStack_630 = (SrcEvaluatorType *)auVar81._8_8_;
  local_640._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar203._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3],0) ^ local_660;
  auVar203._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3] >> 0x20) ^ uStack_65c;
  auVar203._8_4_ = uStack_658;
  auVar203._12_4_ = uStack_654;
  dStack_628 = (double)vmovlps_avx(auVar203);
  local_620 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_618 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_610 = (double)vmovlps_avx(auVar203);
  local_608 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_600 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_5f8 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5f0 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_5e8 = vmovlps_avx(auVar130);
  local_5e0 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5d8 = vmovlps_avx(auVar171);
  local_5d0 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_5c8 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  local_540._0_8_ = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0]
  ;
  local_520 = (ChMatrix33<double> *)
              (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar131._0_4_ = (uint)local_520 ^ local_660;
  auVar131._4_4_ = (uint)((ulong)local_520 >> 0x20) ^ uStack_65c;
  auVar131._8_4_ = uStack_658;
  auVar131._12_4_ = uStack_654;
  unique0x00006b80 = (SrcEvaluatorType *)vmovlps_avx(auVar131);
  uStack_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
               (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar172._0_4_ = (uint)uStack_508 ^ local_660;
  auVar172._4_4_ = (uint)((ulong)uStack_508 >> 0x20) ^ uStack_65c;
  auVar172._8_4_ = uStack_658;
  auVar172._12_4_ = uStack_654;
  uStack_530 = (SrcEvaluatorType *)vmovlps_avx(auVar172);
  local_4f8 = (Matrix<double,_3,_4,_1,_3,_4> *)
              (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar204._0_4_ = (uint)local_4f8 ^ local_660;
  auVar204._4_4_ = (uint)((ulong)local_4f8 >> 0x20) ^ uStack_65c;
  auVar204._8_4_ = uStack_658;
  auVar204._12_4_ = uStack_654;
  dStack_528 = (double)vmovlps_avx(auVar204);
  local_510 = (double)vmovlps_avx(auVar204);
  local_4e8 = (double)vmovlps_avx(auVar131);
  local_4d8 = (double)vmovlps_avx(auVar172);
  uStack_4d0 = (ChMatrix33<double> *)
               (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_4c8 = (DstXprType *)
              (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_518 = (DstXprType *)local_540._0_8_;
  local_500 = uStack_508;
  local_4f0 = (DstXprType *)local_540._0_8_;
  local_4e0 = local_4f8;
  Qconjugate(q);
  local_5c0._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar132._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1],0) ^ local_660;
  auVar132._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] >> 0x20) ^ uStack_65c;
  auVar132._8_4_ = uStack_658;
  auVar132._12_4_ = uStack_654;
  auVar173._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2],0) ^ local_660;
  auVar173._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar173._8_4_ = uStack_658;
  auVar173._12_4_ = uStack_654;
  local_5c0._8_16_ = vmovlhps_avx(auVar132,auVar173);
  auVar205._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3],0) ^ local_660;
  auVar205._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3] >> 0x20) ^ uStack_65c;
  auVar205._8_4_ = uStack_658;
  auVar205._12_4_ = uStack_654;
  local_5a8 = (double)vmovlps_avx(auVar205);
  local_5a0 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_598 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_590 = vmovlps_avx(auVar205);
  local_588 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_580 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_578 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_570 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_568 = vmovlps_avx(auVar132);
  local_560 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_558 = vmovlps_avx(auVar173);
  local_550 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_548 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_510 = (double)CONCAT44(uStack_65c ^ local_510._4_4_,local_660 ^ (uint)local_510);
  uStack_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
               CONCAT44(uStack_654 ^ uStack_508._4_4_,uStack_658 ^ (uint)uStack_508);
  auVar88._0_4_ = (uint)local_4f8 ^ local_660;
  auVar88._4_4_ = (uint)((ulong)local_4f8 >> 0x20) ^ uStack_65c;
  auVar88._8_4_ = uStack_658;
  auVar88._12_4_ = uStack_654;
  local_4f8 = (Matrix<double,_3,_4,_1,_3,_4> *)vmovlps_avx(auVar88);
  auVar89._0_4_ = SUB84(local_4e8,0) ^ local_660;
  auVar89._4_4_ = (uint)((ulong)local_4e8 >> 0x20) ^ uStack_65c;
  auVar89._8_4_ = uStack_658;
  auVar89._12_4_ = uStack_654;
  local_4e8 = (double)vmovlps_avx(auVar89);
  local_4d8 = (double)CONCAT44(uStack_65c ^ local_4d8._4_4_,local_660 ^ (uint)local_4d8);
  uStack_4d0 = (ChMatrix33<double> *)
               CONCAT44(uStack_654 ^ uStack_4d0._4_4_,uStack_658 ^ (uint)uStack_4d0);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_5c0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)local_640;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.97626258336499e-323;
  local_320.m_dst = (DstEvaluatorType *)&local_4a0;
  local_320.m_functor = (assign_op<double,_double> *)local_6a0;
  lVar77 = 0;
  local_4a0.m_data[0] = (double)&local_480;
  local_320.m_src = (SrcEvaluatorType *)&local_300;
  local_320.m_dstExpr = (DstXprType *)&local_480;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run(&local_320,lVar77);
    lVar77 = lVar77 + 1;
  } while (lVar77 != 4);
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 4;
  local_4a0.m_data[0] = (double)&local_300;
  local_320.m_dst = (DstEvaluatorType *)&local_4a0;
  local_320.m_functor = (assign_op<double,_double> *)local_6a0;
  lVar77 = 0;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)local_540;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_480;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)local_540;
  local_320.m_src = (SrcEvaluatorType *)&local_480;
  local_320.m_dstExpr = (DstXprType *)local_4a0.m_data[0];
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_320,lVar77);
    lVar77 = lVar77 + 1;
  } while (lVar77 != 4);
  pdVar75 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array +
            0x18;
  lVar77 = 0;
  do {
    dVar165 = *(double *)
               ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar77 + 8);
    dVar1 = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar77 + 0x10);
    dVar2 = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar77 + 0x18);
    *pdVar75 = *(double *)
                ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar77);
    pdVar75[1] = dVar165;
    pdVar75[2] = dVar1;
    pdVar75[3] = dVar2;
    lVar77 = lVar77 + 0x20;
    pdVar75 = pdVar75 + 7;
  } while (lVar77 != 0x80);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  auVar133._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1],0) ^ local_660;
  auVar133._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] >> 0x20) ^ uStack_65c;
  auVar133._8_4_ = uStack_658;
  auVar133._12_4_ = uStack_654;
  auVar174._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2],0) ^ local_660;
  auVar174._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar174._8_4_ = uStack_658;
  auVar174._12_4_ = uStack_654;
  auVar81 = vmovlhps_avx(auVar133,auVar174);
  local_640._8_8_ = auVar81._0_8_;
  pSStack_630 = (SrcEvaluatorType *)auVar81._8_8_;
  local_640._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar206._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3],0) ^ local_660;
  auVar206._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3] >> 0x20) ^ uStack_65c;
  auVar206._8_4_ = uStack_658;
  auVar206._12_4_ = uStack_654;
  dStack_628 = (double)vmovlps_avx(auVar206);
  local_620 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_618 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_610 = (double)vmovlps_avx(auVar206);
  local_608 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_600 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_5f8 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5f0 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_5e8 = vmovlps_avx(auVar133);
  local_5e0 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5d8 = vmovlps_avx(auVar174);
  local_5d0 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_5c8 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  Qcross(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
          super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
         &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
          super_ChFrame<double>.coord.rot);
  local_540._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar134._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1],0) ^ local_660;
  auVar134._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] >> 0x20) ^ uStack_65c;
  auVar134._8_4_ = uStack_658;
  auVar134._12_4_ = uStack_654;
  auVar175._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2],0) ^ local_660;
  auVar175._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar175._8_4_ = uStack_658;
  auVar175._12_4_ = uStack_654;
  unique0x000f4700 = vmovlhps_avx(auVar134,auVar175);
  auVar207._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3],0) ^ local_660;
  auVar207._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3] >> 0x20) ^ uStack_65c;
  auVar207._8_4_ = uStack_658;
  auVar207._12_4_ = uStack_654;
  dStack_528 = (double)vmovlps_avx(auVar207);
  local_520 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_518 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_510 = (double)vmovlps_avx(auVar207);
  uStack_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
               local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[2];
  local_500 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_4f8 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4f0 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_4e8 = (double)vmovlps_avx(auVar134);
  local_4e0 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4d8 = (double)vmovlps_avx(auVar175);
  uStack_4d0 = (ChMatrix33<double> *)
               local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[1];
  local_4c8 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  Qconjugate(q);
  local_5c0._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar135._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1],0) ^ local_660;
  auVar135._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] >> 0x20) ^ uStack_65c;
  auVar135._8_4_ = uStack_658;
  auVar135._12_4_ = uStack_654;
  auVar176._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2],0) ^ local_660;
  auVar176._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar176._8_4_ = uStack_658;
  auVar176._12_4_ = uStack_654;
  local_5c0._8_16_ = vmovlhps_avx(auVar135,auVar176);
  auVar208._0_4_ =
       SUB84(local_480.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3],0) ^ local_660;
  auVar208._4_4_ =
       (uint)((ulong)local_480.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3] >> 0x20) ^ uStack_65c;
  auVar208._8_4_ = uStack_658;
  auVar208._12_4_ = uStack_654;
  local_5a8 = (double)vmovlps_avx(auVar208);
  local_5a0 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_598 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_590 = vmovlps_avx(auVar208);
  local_588 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_580 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  local_578 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_570 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_568 = vmovlps_avx(auVar135);
  local_560 = (Matrix<double,_3,_4,_1,_3,_4> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_558 = vmovlps_avx(auVar176);
  local_550 = (ChMatrix33<double> *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1];
  local_548 = (DstXprType *)
              local_480.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[0];
  local_510 = (double)CONCAT44(uStack_65c ^ local_510._4_4_,local_660 ^ (uint)local_510);
  uStack_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
               CONCAT44(uStack_654 ^ uStack_508._4_4_,uStack_658 ^ (uint)uStack_508);
  auVar90._0_4_ = (uint)local_4f8 ^ local_660;
  auVar90._4_4_ = (uint)((ulong)local_4f8 >> 0x20) ^ uStack_65c;
  auVar90._8_4_ = uStack_658;
  auVar90._12_4_ = uStack_654;
  local_4f8 = (Matrix<double,_3,_4,_1,_3,_4> *)vmovlps_avx(auVar90);
  auVar91._0_4_ = SUB84(local_4e8,0) ^ local_660;
  auVar91._4_4_ = (uint)((ulong)local_4e8 >> 0x20) ^ uStack_65c;
  auVar91._8_4_ = uStack_658;
  auVar91._12_4_ = uStack_654;
  local_4e8 = (double)vmovlps_avx(auVar91);
  local_4d8 = (double)CONCAT44(uStack_65c ^ local_4d8._4_4_,local_660 ^ (uint)local_4d8);
  uStack_4d0 = (ChMatrix33<double> *)
               CONCAT44(uStack_654 ^ uStack_4d0._4_4_,uStack_658 ^ (uint)uStack_4d0);
  lVar77 = 0x18;
  do {
    uVar70 = *(undefined4 *)((long)&local_548 + lVar77);
    uVar74 = *(uint *)((long)&local_548 + lVar77 + 4);
    *(undefined4 *)((long)&local_550 + lVar77) = *(undefined4 *)((long)&local_550 + lVar77);
    *(uint *)((long)&local_550 + lVar77 + 4) = *(uint *)((long)&local_550 + lVar77 + 4) ^ 0x80000000
    ;
    *(undefined4 *)((long)&local_548 + lVar77) = uVar70;
    *(uint *)((long)&local_548 + lVar77 + 4) = uVar74 ^ 0x80000000;
    auVar92._0_8_ = *(ulong *)(local_540 + lVar77) ^ 0x8000000000000000;
    auVar92._8_4_ = 0;
    auVar92._12_4_ = 0x80000000;
    uVar4 = vmovlps_avx(auVar92);
    *(undefined8 *)(local_540 + lVar77) = uVar4;
    lVar77 = lVar77 + 0x20;
  } while (lVar77 != 0x98);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_5c0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.97626258336499e-323;
  local_320.m_dst = (DstEvaluatorType *)&local_4a0;
  local_320.m_src = (SrcEvaluatorType *)&local_300;
  local_320.m_functor = (assign_op<double,_double> *)local_6a0;
  lVar77 = 0;
  local_4a0.m_data[0] = (double)&local_480;
  local_320.m_dstExpr = (DstXprType *)&local_480;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)local_640;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_640;
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run(&local_320,lVar77);
    lVar77 = lVar77 + 1;
  } while (lVar77 != 4);
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 4;
  local_4a0.m_data[0] = (double)&local_300;
  local_320.m_dst = (DstEvaluatorType *)&local_4a0;
  local_320.m_functor = (assign_op<double,_double> *)local_6a0;
  lVar77 = 0;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)local_540;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_480;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)local_540;
  local_320.m_src = (SrcEvaluatorType *)&local_480;
  local_320.m_dstExpr = (DstXprType *)local_4a0.m_data[0];
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_320,lVar77);
    lVar77 = lVar77 + 1;
  } while (lVar77 != 4);
  pdVar75 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array +
            0x18;
  lVar77 = 0;
  do {
    dVar165 = *(double *)
               ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar77 + 8);
    dVar1 = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar77 + 0x10);
    dVar2 = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar77 + 0x18);
    *pdVar75 = *(double *)
                ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar77);
    pdVar75[1] = dVar165;
    pdVar75[2] = dVar1;
    pdVar75[3] = dVar2;
    lVar77 = lVar77 + 0x20;
    pdVar75 = pdVar75 + 7;
  } while (lVar77 != 0x80);
  local_690 = 0.0;
  auVar69._12_4_ = 0;
  auVar69._0_12_ = ZEXT812(0);
  local_6a0 = auVar69 << 0x20;
  _local_640 = (double  [4])(ZEXT432(0) << 0x20);
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  dVar165 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar165;
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  dVar1 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar1;
  dVar2 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar2;
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       dVar2 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2];
  auVar81 = vfmsub231sd_fma(auVar209,auVar110,auVar136);
  auVar137._8_8_ = 0;
  auVar137._0_8_ =
       dVar165 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar82 = vfmsub231sd_fma(auVar137,auVar177,auVar152);
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       dVar1 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1];
  auVar106 = vfmsub231sd_fma(auVar111,auVar93,auVar191);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       auVar82._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar78 = vfmsub231sd_fma(auVar192,auVar153,auVar106);
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       auVar106._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar106 = vfmsub231sd_fma(auVar112,auVar81,auVar178);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       auVar81._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar81 = vfmsub231sd_fma(auVar154,auVar94,auVar82);
  local_678 = auVar78._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_688 = auVar106._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  local_680 = auVar81._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  dVar165 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar165;
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  dVar1 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = dVar1;
  dVar2 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar2;
  auVar210._8_8_ = 0;
  auVar210._0_8_ =
       dVar2 * local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[2];
  auVar81 = vfmsub231sd_fma(auVar210,auVar113,auVar138);
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       dVar165 * local_480.
                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar82 = vfmsub231sd_fma(auVar139,auVar179,auVar155);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       dVar1 * local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[1];
  auVar106 = vfmsub231sd_fma(auVar114,auVar95,auVar193);
  local_678 = auVar81._0_8_ + auVar81._0_8_ + local_678;
  local_688 = auVar82._0_8_ + auVar82._0_8_ + local_688;
  local_680 = auVar106._0_8_ + auVar106._0_8_ + local_680;
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  dVar165 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar165;
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  dVar1 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar1;
  dVar2 = (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar2;
  auVar211._8_8_ = 0;
  auVar211._0_8_ =
       dVar2 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2];
  auVar81 = vfmsub231sd_fma(auVar211,auVar115,auVar140);
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       dVar165 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar82 = vfmsub231sd_fma(auVar141,auVar180,auVar156);
  auVar116._8_8_ = 0;
  auVar116._0_8_ =
       dVar1 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1];
  auVar106 = vfmsub231sd_fma(auVar116,auVar96,auVar194);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar195._8_8_ = 0;
  auVar195._0_8_ =
       auVar82._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar78 = vfmsub231sd_fma(auVar195,auVar157,auVar106);
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       auVar106._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar106 = vfmsub231sd_fma(auVar117,auVar81,auVar181);
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       auVar81._0_8_ *
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar81 = vfmsub231sd_fma(auVar158,auVar97,auVar82);
  local_4c0 = auVar78._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_4b8 = auVar106._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  local_4b0 = auVar81._0_8_ + (pCVar61->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  dVar165 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar165;
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       local_480.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  dVar1 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar1;
  dVar2 = (pCVar61->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar2;
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       dVar2 * local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[2];
  auVar81 = vfmsub231sd_fma(auVar212,auVar118,auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       dVar165 * local_480.
                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar82 = vfmsub231sd_fma(auVar143,auVar182,auVar159);
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       dVar1 * local_480.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[1];
  auVar106 = vfmsub231sd_fma(auVar119,auVar98,auVar196);
  dVar165 = auVar81._0_8_ + auVar81._0_8_ + local_4c0;
  dVar1 = auVar82._0_8_ + auVar82._0_8_ + local_4b8;
  dVar2 = auVar106._0_8_ + auVar106._0_8_ + local_4b0;
  pCVar62 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  this_00 = &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
             super_ChFrameMoving<double>;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = local_678;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       local_688 *
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar81 = vfmadd231sd_fma(auVar160,auVar197,auVar31);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = local_680;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar81 = vfmadd231sd_fma(auVar81,auVar218,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       local_688 *
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar82 = vfmadd231sd_fma(auVar183,auVar197,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar82 = vfmadd231sd_fma(auVar82,auVar218,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       local_688 *
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar106 = vfmadd231sd_fma(auVar198,auVar197,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)&(pCVar62->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar106 = vfmadd231sd_fma(auVar106,auVar218,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar165;
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       dVar1 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 8);
  auVar78 = vfmadd231sd_fma(auVar213,auVar99,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar2;
  auVar78 = vfmadd231sd_fma(auVar78,auVar120,auVar38);
  dVar3 = auVar81._0_8_ - auVar78._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       dVar1 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar81 = vfmadd231sd_fma(auVar214,auVar99,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar81 = vfmadd231sd_fma(auVar81,auVar120,auVar40);
  dVar126 = auVar82._0_8_ - auVar81._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar165;
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       dVar1 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x38);
  auVar81 = vfmadd231sd_fma(auVar144,auVar100,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar2;
  auVar81 = vfmadd231sd_fma(auVar81,auVar121,auVar42);
  dVar165 = auVar106._0_8_ - auVar81._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       dVar126 * local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar3;
  auVar81 = vfmadd231sd_fma(auVar122,auVar161,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar165;
  auVar81 = vfmadd231sd_fma(auVar81,auVar101,auVar44);
  local_680 = auVar81._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       dVar126 * local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
  auVar81 = vfmadd231sd_fma(auVar123,auVar161,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar81 = vfmadd231sd_fma(auVar81,auVar101,auVar46);
  local_678 = auVar81._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar3;
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       dVar126 * local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[7];
  auVar81 = vfmadd231sd_fma(auVar184,auVar162,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_3b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar165;
  auVar81 = vfmadd231sd_fma(auVar81,auVar102,auVar48);
  local_690 = auVar81._0_8_;
  local_688 = local_690;
  local_6a0._0_8_ = local_680;
  local_6a0._8_8_ = local_678;
  ChFrameMoving<double>::GetWvel_loc(this_00);
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  auVar124._0_4_ =
       SUB84(local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2],0) ^ local_660;
  auVar124._4_4_ =
       (uint)((ulong)local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[2] >> 0x20) ^ uStack_65c;
  auVar124._8_4_ = uStack_658;
  auVar124._12_4_ = uStack_654;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)vmovlps_avx(auVar124);
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5].
  _0_4_ = local_660 ^
          local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0]._0_4_;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5].
  _4_4_ = uStack_65c ^
          local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0]._4_4_;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6].
  _0_4_ = uStack_658 ^
          local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1]._0_4_;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6].
  _4_4_ = uStack_654 ^
          local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1]._4_4_;
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_480.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_540._0_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  unique0x1000ee19 = &local_480;
  uStack_530 = &local_480;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((ChMatrix33<double> *)&local_300,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_540);
  pCVar61 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  dVar165 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       dVar165 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[3];
  auVar81 = vfmadd231sd_fma(auVar145,auVar103,auVar49);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [6];
  auVar81 = vfmadd231sd_fma(auVar81,auVar163,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       dVar165 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[4];
  auVar82 = vfmadd231sd_fma(auVar185,auVar103,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [7];
  auVar82 = vfmadd231sd_fma(auVar82,auVar163,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       dVar165 * local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[5];
  auVar106 = vfmadd231sd_fma(auVar125,auVar103,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_300.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  auVar106 = vfmadd231sd_fma(auVar106,auVar163,auVar54);
  dVar165 = auVar82._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar82 = vfmadd231sd_fma(auVar104,auVar81,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar82 = vfmadd231sd_fma(auVar82,auVar106,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar78 = vfmadd231sd_fma(auVar164,auVar81,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar78 = vfmadd231sd_fma(auVar78,auVar106,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       dVar165 * *(double *)
                  ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar81 = vfmadd231sd_fma(auVar186,auVar81,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       *(double *)
        ((long)&(pCVar61->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar81 = vfmadd231sd_fma(auVar81,auVar106,auVar60);
  local_690 = (auVar81._0_8_ + local_688 +
              (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[2]) -
              (this->deltaC_dtdt).pos.m_data[2];
  local_6a0._8_8_ =
       (auVar78._0_8_ + local_678 + (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[1]) -
       (this->deltaC_dtdt).pos.m_data[1];
  local_6a0._0_8_ =
       (auVar82._0_8_ + local_680 + (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[0]) -
       (this->deltaC_dtdt).pos.m_data[0];
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_5c0,&(this->super_ChLinkLock).super_ChLinkMarkers.q_8);
  local_640._8_8_ = stack0xfffffffffffffac8;
  local_640._0_8_ = local_540._0_8_;
  pSStack_630 = uStack_530;
  dStack_628 = dStack_528;
  Qconjugate(local_668);
  Qcross(&local_4a0,local_648);
  Qscale((ChQuaternion<double> *)local_5c0,(ChQuaternion<double> *)&local_320,2.0);
  Qadd((ChQuaternion<double> *)local_640,(ChQuaternion<double> *)local_5c0);
  local_640._8_8_ = stack0xfffffffffffffac8;
  local_640._0_8_ = local_540._0_8_;
  pSStack_630 = uStack_530;
  dStack_628 = dStack_528;
  Qconjugate(local_4a8);
  Qcross((ChQuaternion<double> *)&local_320,local_670);
  Qadd((ChQuaternion<double> *)local_640,(ChQuaternion<double> *)local_5c0);
  local_640._8_8_ = stack0xfffffffffffffac8;
  local_640._0_8_ = local_540._0_8_;
  pSStack_630 = uStack_530;
  dStack_628 = dStack_528;
  __dest = &(this->super_ChLinkLock).Qc_temp;
  uVar73 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 6;
  uVar74 = 3;
  if (uVar73 < 3) {
    uVar74 = uVar73;
  }
  if (uVar73 != 0) {
    memcpy(__dest,local_6a0,(ulong)(uVar74 * 8));
  }
  if (uVar74 != 3) {
    uVar76 = (ulong)(uVar74 << 3);
    memcpy((void *)((long)(this->super_ChLinkLock).Qc_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                          m_data.array + uVar76),local_6a0 + uVar76,0x18 - uVar76);
  }
  pdVar75 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 3;
  uVar73 = -((uint)((ulong)pdVar75 >> 3) & 0x1fffffff) & 7;
  uVar74 = 4;
  if (uVar73 < 4) {
    uVar74 = uVar73;
  }
  memcpy(pdVar75,local_640,(ulong)(uVar74 * 8));
  if (uVar73 < 4) {
    uVar76 = (ulong)(uVar74 << 3);
    memcpy((void *)((long)(this->super_ChLinkLock).Qc_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                          m_data.array + uVar76 + 0x18),local_640 + uVar76,0x20 - uVar76);
  }
  uVar74 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 4);
  uVar70 = *(undefined4 *)
            ((this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 1
            );
  uVar73 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0xc);
  *(undefined4 *)
   (this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
   m_storage.m_data.array =
       *(undefined4 *)
        (this->super_ChLinkLock).Qc_temp.
        super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 4) = uVar74 ^ 0x80000000;
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 1) = uVar70;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0xc) = uVar73 ^ 0x80000000;
  uVar74 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x14);
  uVar70 = *(undefined4 *)
            ((this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 3
            );
  uVar73 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x1c);
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 2) =
       *(undefined4 *)
        ((this->super_ChLinkLock).Qc_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 2);
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x14) = uVar74 ^ 0x80000000;
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 3) = uVar70;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x1c) = uVar73 ^ 0x80000000;
  uVar74 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x24);
  uVar70 = *(undefined4 *)
            ((this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 5
            );
  uVar73 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x2c);
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 4) =
       *(undefined4 *)
        ((this->super_ChLinkLock).Qc_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 4);
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x24) = uVar74 ^ 0x80000000;
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 5) = uVar70;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x2c) = uVar73 ^ 0x80000000;
  auVar105._0_8_ =
       -(this->super_ChLinkLock).Qc_temp.
        super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[6];
  auVar105._8_4_ = 0;
  auVar105._12_4_ = 0x80000000;
  dVar165 = (double)vmovlps_avx(auVar105);
  (this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
  m_storage.m_data.array[6] = dVar165;
  uVar74 = 0;
  if (((*(this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
      active == true) {
    if (0 < (this->super_ChLinkLock).Cq1.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
      dVar165 = (this->super_ChLinkLock).Cq1_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [1];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[0] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[0];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[1] = dVar165;
      dVar165 = (this->super_ChLinkLock).Cq1_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [3];
      dVar1 = (this->super_ChLinkLock).Cq1_temp.
              super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[4]
      ;
      dVar2 = (this->super_ChLinkLock).Cq1_temp.
              super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[5]
      ;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[2] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[2];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[3] = dVar165;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[4] = dVar1;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[5] = dVar2;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[6] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[6];
      if (0 < (this->super_ChLinkLock).Cq2.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
        dVar165 = (this->super_ChLinkLock).Cq2_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[1];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[0] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[0];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[1] = dVar165;
        dVar165 = (this->super_ChLinkLock).Cq2_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[3];
        dVar1 = (this->super_ChLinkLock).Cq2_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [4];
        dVar2 = (this->super_ChLinkLock).Cq2_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [5];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[2] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[2];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[3] = dVar165;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[4] = dVar1;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[5] = dVar2;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[6] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[6];
        if (((((this->super_ChLinkLock).Qc.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1)
             || ((this->super_ChLinkLock).Qc.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                 array[0] = (this->super_ChLinkLock).Qc_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                            m_data.array[0],
                (this->super_ChLinkLock).C.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1))
            || ((this->super_ChLinkLock).C.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC).pos.m_data[0],
               (this->super_ChLinkLock).C_dt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1))
           || (((this->super_ChLinkLock).C_dt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC_dt).pos.m_data[0],
               (this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1 ||
               ((this->super_ChLinkLock).C_dtdt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC_dtdt).pos.m_data[0],
               (this->super_ChLinkLock).Ct.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1)))
           ) goto LAB_00598a3f;
        (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
        m_storage.m_data.array[0] = (this->super_ChLinkLock).Ct_temp.pos.m_data[0];
        uVar74 = 1;
        goto LAB_005983b9;
      }
    }
  }
  else {
LAB_005983b9:
    if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
         ._M_impl.super__Vector_impl_data._M_start[1]->super_ChConstraintTwo).super_ChConstraint.
        active == true) {
      uVar76 = (ulong)uVar74;
      if ((long)uVar76 <
          (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_rows) {
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[8];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[7];
        pdVar75[1] = dVar165;
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[10];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7 + 2;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[9];
        pdVar75[1] = dVar165;
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0xc];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7 + 4;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0xb];
        pdVar75[1] = dVar165;
        (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[uVar76 * 7 + 6] =
             (this->super_ChLinkLock).Cq1_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
             [0xd];
        if ((long)uVar76 <
            (this->super_ChLinkLock).Cq2.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[8];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[7];
          pdVar75[1] = dVar165;
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[10];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7 + 2;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[9];
          pdVar75[1] = dVar165;
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0xc];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7 + 4;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0xb];
          pdVar75[1] = dVar165;
          (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_data.array[uVar76 * 7 + 6] =
               (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0xd];
          if ((((this->super_ChLinkLock).Qc.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                (long)uVar76) ||
              ((this->super_ChLinkLock).Qc.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar76] = (this->super_ChLinkLock).Qc_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                          m_data.array[1],
              (this->super_ChLinkLock).C.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar76)) ||
             (((this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar76] = (this->relC).pos.m_data[1],
              (this->super_ChLinkLock).C_dt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar76 ||
              (((this->super_ChLinkLock).C_dt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar76] = (this->relC_dt).pos.m_data[1],
               (this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
               (long)uVar76 ||
               ((this->super_ChLinkLock).C_dtdt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar76] = (this->relC_dtdt).pos.m_data[1],
               (this->super_ChLinkLock).Ct.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
               (long)uVar76)))))) goto LAB_00598a3f;
          (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
          m_storage.m_data.array[uVar76] = (this->super_ChLinkLock).Ct_temp.pos.m_data[1];
          uVar74 = uVar74 + 1;
          goto LAB_0059850e;
        }
      }
    }
    else {
LAB_0059850e:
      if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[2]->super_ChConstraintTwo).super_ChConstraint.
          active != true) {
LAB_00598663:
        if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start[3]->super_ChConstraintTwo).super_ChConstraint
            .active == true) {
          uVar76 = (ulong)uVar74;
          if ((long)uVar76 <
              (this->super_ChLinkLock).Cq1.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
            dVar165 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x19];
            dVar1 = (this->super_ChLinkLock).Cq1_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x1a];
            dVar2 = (this->super_ChLinkLock).Cq1_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x1b];
            pdVar75 = (this->super_ChLinkLock).Cq1.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data
                      .array + uVar76 * 7 + 3;
            *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                       super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data
                       .array[0x18];
            pdVar75[1] = dVar165;
            pdVar75[2] = dVar1;
            pdVar75[3] = dVar2;
            if ((long)uVar76 <
                (this->super_ChLinkLock).Cq2.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
              dVar165 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x19];
              dVar1 = (this->super_ChLinkLock).Cq2_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x1a];
              dVar2 = (this->super_ChLinkLock).Cq2_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x1b];
              pdVar75 = (this->super_ChLinkLock).Cq2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                        m_data.array + uVar76 * 7 + 3;
              *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                         m_data.array[0x18];
              pdVar75[1] = dVar165;
              pdVar75[2] = dVar1;
              pdVar75[3] = dVar2;
              if ((((this->super_ChLinkLock).Qc.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar76) ||
                  ((this->super_ChLinkLock).Qc.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[uVar76] =
                        (this->super_ChLinkLock).Qc_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[3],
                  (this->super_ChLinkLock).C.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                  (long)uVar76)) ||
                 (((this->super_ChLinkLock).C.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[uVar76] = (this->relC).rot.m_data[0],
                  (this->super_ChLinkLock).C_dt.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                  (long)uVar76 ||
                  (((this->super_ChLinkLock).C_dt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar76] = (this->relC_dt).rot.m_data[0],
                   (this->super_ChLinkLock).C_dtdt.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                   (long)uVar76 ||
                   ((this->super_ChLinkLock).C_dtdt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar76] = (this->relC_dtdt).rot.m_data[0],
                   (this->super_ChLinkLock).Ct.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                   (long)uVar76)))))) goto LAB_00598a3f;
              (this->super_ChLinkLock).Ct.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
              [uVar76] = (this->super_ChLinkLock).Ct_temp.rot.m_data[0];
              uVar74 = uVar74 + 1;
              goto LAB_0059875a;
            }
          }
        }
        else {
LAB_0059875a:
          if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[4]->super_ChConstraintTwo).
              super_ChConstraint.active == true) {
            uVar76 = (ulong)uVar74;
            if ((long)uVar76 <
                (this->super_ChLinkLock).Cq1.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
              dVar165 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x20];
              dVar1 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x21];
              dVar2 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x22];
              pdVar75 = (this->super_ChLinkLock).Cq1.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                        m_data.array + uVar76 * 7 + 3;
              *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                         m_data.array[0x1f];
              pdVar75[1] = dVar165;
              pdVar75[2] = dVar1;
              pdVar75[3] = dVar2;
              if ((long)uVar76 <
                  (this->super_ChLinkLock).Cq2.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar165 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x20];
                dVar1 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x21];
                dVar2 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x22];
                pdVar75 = (this->super_ChLinkLock).Cq2.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar76 * 7 + 3;
                *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x1f];
                pdVar75[1] = dVar165;
                pdVar75[2] = dVar1;
                pdVar75[3] = dVar2;
                if (((((this->super_ChLinkLock).Qc.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar76) ||
                     ((this->super_ChLinkLock).Qc.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data
                      .array[uVar76] =
                           (this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array[4],
                     (this->super_ChLinkLock).C.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                     <= (long)uVar76)) ||
                    ((this->super_ChLinkLock).C.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar76] = (this->relC).rot.m_data[1],
                    (this->super_ChLinkLock).C_dt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar76)) ||
                   (((this->super_ChLinkLock).C_dt.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar76] = (this->relC_dt).rot.m_data[1],
                    (this->super_ChLinkLock).C_dtdt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar76 ||
                    ((this->super_ChLinkLock).C_dtdt.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar76] = (this->relC_dtdt).rot.m_data[1],
                    (this->super_ChLinkLock).Ct.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar76)))) goto LAB_00598a3f;
                (this->super_ChLinkLock).Ct.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar76] = (this->super_ChLinkLock).Ct_temp.rot.m_data[1];
                uVar74 = uVar74 + 1;
                goto LAB_00598851;
              }
            }
          }
          else {
LAB_00598851:
            if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[5]->super_ChConstraintTwo).
                super_ChConstraint.active == true) {
              uVar76 = (ulong)uVar74;
              if ((long)uVar76 <
                  (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar165 = (this->super_ChLinkLock).Cq1_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x27];
                dVar1 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x28];
                dVar2 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x29];
                pdVar75 = (this->super_ChLinkLock).Cq1.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar76 * 7 + 3;
                *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x26];
                pdVar75[1] = dVar165;
                pdVar75[2] = dVar1;
                pdVar75[3] = dVar2;
                if ((long)uVar76 <
                    (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows)
                {
                  dVar165 = (this->super_ChLinkLock).Cq2_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                            m_data.array[0x27];
                  dVar1 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x28];
                  dVar2 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x29];
                  pdVar75 = (this->super_ChLinkLock).Cq2.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                            m_data.array + uVar76 * 7 + 3;
                  *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                             m_data.array[0x26];
                  pdVar75[1] = dVar165;
                  pdVar75[2] = dVar1;
                  pdVar75[3] = dVar2;
                  if ((((this->super_ChLinkLock).Qc.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_rows <= (long)uVar76) ||
                      ((this->super_ChLinkLock).Qc.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar76] =
                            (this->super_ChLinkLock).Qc_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                            m_data.array[5],
                      (this->super_ChLinkLock).C.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      <= (long)uVar76)) ||
                     (((this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar76] = (this->relC).rot.m_data[2],
                      (this->super_ChLinkLock).C_dt.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      <= (long)uVar76 ||
                      (((this->super_ChLinkLock).C_dt.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar76] = (this->relC_dt).rot.m_data[2],
                       (this->super_ChLinkLock).C_dtdt.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar76 ||
                       ((this->super_ChLinkLock).C_dtdt.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar76] = (this->relC_dtdt).rot.m_data[2],
                       (this->super_ChLinkLock).Ct.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar76)))))) goto LAB_00598a3f;
                  (this->super_ChLinkLock).Ct.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                  array[uVar76] = (this->super_ChLinkLock).Ct_temp.rot.m_data[2];
                  uVar74 = uVar74 + 1;
                  goto LAB_00598948;
                }
              }
            }
            else {
LAB_00598948:
              if (((this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
                   super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]->super_ChConstraintTwo).
                  super_ChConstraint.active != true) {
                return;
              }
              uVar76 = (ulong)uVar74;
              if ((long)uVar76 <
                  (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar165 = (this->super_ChLinkLock).Cq1_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x2e];
                dVar1 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x2f];
                dVar2 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x30];
                pdVar75 = (this->super_ChLinkLock).Cq1.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar76 * 7 + 3;
                *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x2d];
                pdVar75[1] = dVar165;
                pdVar75[2] = dVar1;
                pdVar75[3] = dVar2;
                if ((long)uVar76 <
                    (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows)
                {
                  dVar165 = (this->super_ChLinkLock).Cq2_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                            m_data.array[0x2e];
                  dVar1 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x2f];
                  dVar2 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x30];
                  pdVar75 = (this->super_ChLinkLock).Cq2.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                            m_data.array + uVar76 * 7 + 3;
                  *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                             m_data.array[0x2d];
                  pdVar75[1] = dVar165;
                  pdVar75[2] = dVar1;
                  pdVar75[3] = dVar2;
                  if (((((long)uVar76 <
                         (this->super_ChLinkLock).Qc.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                         m_rows) &&
                       ((this->super_ChLinkLock).Qc.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar76] =
                             (this->super_ChLinkLock).Qc_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                             m_data.array[6],
                       (long)uVar76 <
                       (this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows)) &&
                      ((this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar76] = (this->relC).rot.m_data[3],
                      (long)uVar76 <
                      (this->super_ChLinkLock).C_dt.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      )) && (((this->super_ChLinkLock).C_dt.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
                              m_storage.m_data.array[uVar76] = (this->relC_dt).rot.m_data[3],
                             (long)uVar76 <
                             (this->super_ChLinkLock).C_dtdt.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage
                             .m_rows &&
                             ((this->super_ChLinkLock).C_dtdt.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
                              m_storage.m_data.array[uVar76] = (this->relC_dtdt).rot.m_data[3],
                             (long)uVar76 <
                             (this->super_ChLinkLock).Ct.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage
                             .m_rows)))) {
                    (this->super_ChLinkLock).Ct.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar76] = (this->super_ChLinkLock).Ct_temp.rot.m_data[3];
                    return;
                  }
LAB_00598a3f:
                  __assert_fail("index >= 0 && index < size()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
                               );
                }
              }
            }
          }
        }
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 7, 1, 7, 7>, 1, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, 7, 1, 7, 7>, BlockRows = 1, BlockCols = 4, InnerPanel = false]"
        ;
        goto LAB_00598a8d;
      }
      uVar76 = (ulong)uVar74;
      if ((long)uVar76 <
          (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_rows) {
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0xf];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0xe];
        pdVar75[1] = dVar165;
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0x11];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7 + 2;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0x10];
        pdVar75[1] = dVar165;
        dVar165 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0x13];
        pdVar75 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar76 * 7 + 4;
        *pdVar75 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0x12];
        pdVar75[1] = dVar165;
        (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[uVar76 * 7 + 6] =
             (this->super_ChLinkLock).Cq1_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
             [0x14];
        if ((long)uVar76 <
            (this->super_ChLinkLock).Cq2.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0xf];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0xe];
          pdVar75[1] = dVar165;
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x11];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7 + 2;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0x10];
          pdVar75[1] = dVar165;
          dVar165 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x13];
          pdVar75 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar76 * 7 + 4;
          *pdVar75 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0x12];
          pdVar75[1] = dVar165;
          (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_data.array[uVar76 * 7 + 6] =
               (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x14];
          if (((((this->super_ChLinkLock).Qc.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                 (long)uVar76) ||
               ((this->super_ChLinkLock).Qc.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar76] = (this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array[2],
               (this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
               (long)uVar76)) ||
              ((this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar76] = (this->relC).pos.m_data[2],
              (this->super_ChLinkLock).C_dt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar76)) ||
             (((this->super_ChLinkLock).C_dt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar76] = (this->relC_dt).pos.m_data[2],
              (this->super_ChLinkLock).C_dtdt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar76 ||
              ((this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar76] = (this->relC_dtdt).pos.m_data[2],
              (this->super_ChLinkLock).Ct.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar76)))) goto LAB_00598a3f;
          (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
          m_storage.m_data.array[uVar76] = (this->super_ChLinkLock).Ct_temp.pos.m_data[2];
          uVar74 = uVar74 + 1;
          goto LAB_00598663;
        }
      }
    }
  }
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, 7, 1, 7, 7>, 1, 7>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, 7, 1, 7, 7>, BlockRows = 1, BlockCols = 7, InnerPanel = false]"
  ;
LAB_00598a8d:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
}

Assistant:

void ChLinkLockLock::UpdateState() {
    // ----------- SOME PRECALCULATED VARIABLES, to optimize speed

    ChStarMatrix33<> P1star(marker1->GetCoord().pos);  // [P] star matrix of rel pos of mark1
    ChStarMatrix33<> Q2star(marker2->GetCoord().pos);  // [Q] star matrix of rel pos of mark2

    ChGlMatrix34<> body1Gl(Body1->GetCoord().rot);
    ChGlMatrix34<> body2Gl(Body2->GetCoord().rot);

    // ----------- RELATIVE LINK-LOCK COORDINATES (violations)

    // relC.pos
    relC.pos = Vsub(relM.pos, deltaC.pos);

    // relC.rot
    relC.rot = Qcross(Qconjugate(deltaC.rot), relM.rot);

    // relC_dt.pos
    relC_dt.pos = Vsub(relM_dt.pos, deltaC_dt.pos);

    // relC_dt.rot
    relC_dt.rot = Qadd(Qcross(Qconjugate(deltaC_dt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dt.rot));

    // relC_dtdt.pos
    relC_dtdt.pos = Vsub(relM_dtdt.pos, deltaC_dtdt.pos);

    // relC_dtdt.rot
    relC_dtdt.rot =
        Qadd(Qadd(Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dtdt.rot)),
             Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));

    // Compute the Cq Ct Qc matrices (temporary, for complete lock constraint)

    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    // ----------- PARTIAL DERIVATIVE Ct OF CONSTRAINT
    Ct_temp.pos =
        m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
        marker2->GetA().transpose() *
            (Body2->GetA().transpose() * (Body1->GetA() * marker1->GetCoord_dt().pos) - marker2->GetCoord_dt().pos);
    Ct_temp.pos -= deltaC_dt.pos;  // the deltaC contribute

    // deltaC^*(q_AD) + deltaC_dt^*q_pq
    Ct_temp.rot = Qcross(Qconjugate(deltaC.rot), q_AD) + Qcross(Qconjugate(deltaC_dt.rot), relM.rot);

    //------------ COMPLETE JACOBIANS Cq1_temp AND Cq2_temp AND Qc_temp VECTOR.
    // [Cq_temp]= [[CqxT] [CqxR]]     {Qc_temp} ={[Qcx]}
    //            [[ 0  ] [CqrR]]                {[Qcr]}

    //  JACOBIANS Cq1_temp, Cq2_temp:

    ChMatrix33<> CqxT = marker2->GetA().transpose() * Body2->GetA().transpose();  // [CqxT]=[Aq]'[Ao2]'
    ChStarMatrix33<> tmpStar(Body2->GetA().transpose() * PQw);

    Cq1_temp.topLeftCorner<3, 3>() = CqxT;                                              // *- -- Cq1_temp(1-3)  =[Aqo2]
    Cq2_temp.topLeftCorner<3, 3>() = -CqxT;                                             // -- *- Cq2_temp(1-3)  =-[Aqo2]
    Cq1_temp.topRightCorner<3, 4>() = -CqxT * Body1->GetA() * P1star * body1Gl;         // -* -- Cq1_temp(4-7)
    Cq2_temp.topRightCorner<3, 4>() = CqxT * Body2->GetA() * Q2star * body2Gl +         //
                                      marker2->GetA().transpose() * tmpStar * body2Gl;  // -- -* Cq2_temp(4-7)

    {
        ChStarMatrix44<> stempQ1(Qcross(Qconjugate(marker2->GetCoord().rot), Qconjugate(Body2->GetCoord().rot)));
        ChStarMatrix44<> stempQ2(marker1->GetCoord().rot);
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        Cq1_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // =* == Cq1_temp(col 4-7, row 4-7) ... CqrR
    }

    {
        ChStarMatrix44<> stempQ1(Qconjugate(marker2->GetCoord().rot));
        ChStarMatrix44<> stempQ2(Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot));
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        stempQ2.semiNegate();
        Cq2_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // == =* Cq2_temp(col 4-7, row 4-7) ... CqrR
    }

    //--------- COMPLETE Qc VECTOR
    ChVector<> Qcx;
    ChQuaternion<> Qcr;
    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Vcross(Body1->GetWvel_loc(), Vcross(Body1->GetWvel_loc(), marker1->GetCoord().pos));
    vtemp1 = Vadd(vtemp1, marker1->GetCoord_dtdt().pos);
    vtemp1 = Vadd(vtemp1, Vmul(Vcross(Body1->GetWvel_loc(), marker1->GetCoord_dt().pos), 2));

    vtemp2 = Vcross(Body2->GetWvel_loc(), Vcross(Body2->GetWvel_loc(), marker2->GetCoord().pos));
    vtemp2 = Vadd(vtemp2, marker2->GetCoord_dtdt().pos);
    vtemp2 = Vadd(vtemp2, Vmul(Vcross(Body2->GetWvel_loc(), marker2->GetCoord_dt().pos), 2));

    Qcx = CqxT * (Body1->GetA() * vtemp1 - Body2->GetA() * vtemp2);

    ChStarMatrix33<> mtemp1(Body2->GetWvel_loc());
    ChMatrix33<> mtemp3 = Body2->GetA() * mtemp1 * mtemp1;
    vtemp2 = marker2->GetA().transpose() * (mtemp3.transpose() * PQw);  // [Aq]'[[A2][w2][w2]]'*Qpq,w
    Qcx = Vadd(Qcx, vtemp2);
    Qcx = Vadd(Qcx, q_4);              // [Adtdt]'[A]'q + 2[Adt]'[Adt]'q + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    Qcx = Vsub(Qcx, deltaC_dtdt.pos);  // ... - deltaC_dtdt

    Qcr = Qcross(Qconjugate(deltaC.rot), q_8);
    Qcr = Qadd(Qcr, Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));
    Qcr = Qadd(Qcr, Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot));  // = deltaC'*q_8 + 2*deltaC_dt'*q_dt,po +
                                                                     // deltaC_dtdt'*q,po

    Qc_temp.segment(0, 3) = Qcx.eigen();  // * Qc_temp, for all translational coords
    Qc_temp.segment(3, 4) = Qcr.eigen();  // * Qc_temp, for all rotational coords

    // *** NOTE! The definitive  Qc must change sign, to be used in
    // lagrangian equation:    [Cq]*q_dtdt = Qc
    // because until now we have computed it as [Cq]*q_dtdt + "Qc" = 0,
    // but the most used form is the previous, so let's change sign!!
    Qc_temp *= -1;

    // ---------------------
    // Updates Cq1, Cq2, Qc,
    // C, C_dt, C_dtdt, Ct.
    // ---------------------
    int index = 0;

    if (mask.Constr_X().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(0, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(0, 0);

        Qc(index) = Qc_temp(0);

        C(index) = relC.pos.x();
        C_dt(index) = relC_dt.pos.x();
        C_dtdt(index) = relC_dtdt.pos.x();

        Ct(index) = Ct_temp.pos.x();

        index++;
    }

    if (mask.Constr_Y().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(1, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(1, 0);

        Qc(index) = Qc_temp(1);

        C(index) = relC.pos.y();
        C_dt(index) = relC_dt.pos.y();
        C_dtdt(index) = relC_dtdt.pos.y();

        Ct(index) = Ct_temp.pos.y();

        index++;
    }

    if (mask.Constr_Z().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(2, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(2, 0);

        Qc(index) = Qc_temp(2);

        C(index) = relC.pos.z();
        C_dt(index) = relC_dt.pos.z();
        C_dtdt(index) = relC_dtdt.pos.z();

        Ct(index) = Ct_temp.pos.z();

        index++;
    }

    if (mask.Constr_E0().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(3, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(3, 3);

        Qc(index) = Qc_temp(3);

        C(index) = relC.rot.e0();
        C_dt(index) = relC_dt.rot.e0();
        C_dtdt(index) = relC_dtdt.rot.e0();

        Ct(index) = Ct_temp.rot.e0();

        index++;
    }

    if (mask.Constr_E1().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(4, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(4, 3);

        Qc(index) = Qc_temp(4);

        C(index) = relC.rot.e1();
        C_dt(index) = relC_dt.rot.e1();
        C_dtdt(index) = relC_dtdt.rot.e1();

        Ct(index) = Ct_temp.rot.e1();

        index++;
    }

    if (mask.Constr_E2().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(5, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(5, 3);

        Qc(index) = Qc_temp(5);

        C(index) = relC.rot.e2();
        C_dt(index) = relC_dt.rot.e2();
        C_dtdt(index) = relC_dtdt.rot.e2();

        Ct(index) = Ct_temp.rot.e2();

        index++;
    }

    if (mask.Constr_E3().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(6, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(6, 3);

        Qc(index) = Qc_temp(6);

        C(index) = relC.rot.e3();
        C_dt(index) = relC_dt.rot.e3();
        C_dtdt(index) = relC_dtdt.rot.e3();

        Ct(index) = Ct_temp.rot.e3();

        index++;
    }
}